

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O0

bool __thiscall CaDiCaL::block_more_occs_size::operator()(block_more_occs_size *this,uint a,uint b)

{
  ulong uVar1;
  ulong *puVar2;
  uint in_EDX;
  uint in_ESI;
  undefined8 *in_RDI;
  size_t t;
  size_t s;
  int in_stack_ffffffffffffffac;
  Internal *in_stack_ffffffffffffffb0;
  Internal *this_00;
  undefined1 local_1;
  
  Internal::u2i((Internal *)*in_RDI,in_ESI);
  puVar2 = (ulong *)Internal::noccs(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  uVar1 = *puVar2;
  Internal::u2i((Internal *)*in_RDI,in_EDX);
  puVar2 = (ulong *)Internal::noccs(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  if (*puVar2 < uVar1) {
    local_1 = true;
  }
  else if (uVar1 < *puVar2) {
    local_1 = false;
  }
  else {
    this_00 = (Internal *)*in_RDI;
    Internal::u2i((Internal *)*in_RDI,in_ESI);
    puVar2 = (ulong *)Internal::noccs(this_00,in_stack_ffffffffffffffac);
    uVar1 = *puVar2;
    Internal::u2i((Internal *)*in_RDI,in_EDX);
    puVar2 = (ulong *)Internal::noccs(this_00,in_stack_ffffffffffffffac);
    if (*puVar2 < uVar1) {
      local_1 = true;
    }
    else if (uVar1 < *puVar2) {
      local_1 = false;
    }
    else {
      local_1 = in_EDX < in_ESI;
    }
  }
  return local_1;
}

Assistant:

inline bool block_more_occs_size::operator() (unsigned a, unsigned b) {
  size_t s = internal->noccs (-internal->u2i (a));
  size_t t = internal->noccs (-internal->u2i (b));
  if (s > t)
    return true;
  if (s < t)
    return false;
  s = internal->noccs (internal->u2i (a));
  t = internal->noccs (internal->u2i (b));
  if (s > t)
    return true;
  if (s < t)
    return false;
  return a > b;
}